

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

uint32_t xor_vector16(uint16_t *array1,uint32_t length1,uint16_t *array2,uint32_t length2,
                     uint16_t *output)

{
  undefined1 auVar1 [16];
  __m128i newval;
  __m128i newval_00;
  __m128i newval_01;
  __m128i newval_02;
  __m128i old;
  __m128i old_00;
  __m128i old_01;
  __m128i old_02;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int32_t iVar11;
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  uint in_ESI;
  undefined1 (*in_RDI) [16];
  long in_R8;
  uint16_t vec6;
  uint16_t vec7;
  int leftoversize;
  uint32_t len;
  uint16_t curB;
  uint16_t curA;
  uint16_t buffer [17];
  uint32_t pos2;
  uint32_t pos1;
  uint32_t len2;
  uint32_t len1;
  uint16_t *initoutput;
  __m128i laststore;
  __m128i vecMax;
  __m128i vecMin;
  __m128i V;
  __m128i vB;
  __m128i vA;
  uint16_t *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined2 uVar12;
  undefined2 in_stack_fffffffffffffec8;
  short in_stack_fffffffffffffeca;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  ushort in_stack_fffffffffffffed4;
  ushort in_stack_fffffffffffffed6;
  longlong in_stack_fffffffffffffed8;
  uint16_t *in_stack_fffffffffffffee0;
  int32_t in_stack_fffffffffffffeec;
  uint16_t *in_stack_fffffffffffffef0;
  int32_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __m128i local_d8;
  longlong local_c8 [2];
  __m128i local_b8;
  __m128i local_a8;
  __m128i local_98;
  void *local_80;
  uint local_74;
  undefined1 (*local_70) [16];
  uint local_64;
  undefined1 (*local_60) [16];
  uint32_t local_54;
  undefined1 (*local_50) [16];
  undefined1 (*local_48) [16];
  undefined2 local_2a;
  undefined1 local_28 [16];
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  if ((in_ESI < 8) || (in_ECX < 8)) {
    uVar2 = xor_uint16((uint16_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec
                       ,in_stack_fffffffffffffee0);
    return uVar2;
  }
  uVar3 = in_ESI >> 3;
  uVar4 = in_ECX >> 3;
  local_98 = (__m128i)vlddqu_avx(*in_RDI);
  uVar5 = 1;
  local_a8 = (__m128i)vlddqu_avx(*in_RDX);
  uVar6 = 1;
  local_80 = (void *)in_R8;
  local_74 = in_ECX;
  local_70 = in_RDX;
  local_64 = in_ESI;
  local_60 = in_RDI;
  sse_merge(&local_98,&local_a8,&local_c8,&local_d8);
  local_2a = 0xffff;
  uVar12 = 0xffff;
  local_2 = 0xffff;
  local_4 = 0xffff;
  local_6 = 0xffff;
  local_8 = 0xffff;
  local_a = 0xffff;
  local_c = 0xffff;
  local_e = 0xffff;
  local_10 = 0xffff;
  auVar1 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,0xffff,6);
  local_28 = vpinsrw_avx(auVar1,0xffff,7);
  old[0]._4_2_ = in_stack_fffffffffffffed4;
  old[0]._0_4_ = in_stack_fffffffffffffed0;
  old[0]._6_2_ = in_stack_fffffffffffffed6;
  old[1] = in_stack_fffffffffffffed8;
  newval[0]._6_2_ = 0xffff;
  newval[0]._0_6_ = in_stack_fffffffffffffec0;
  newval[1]._0_2_ = in_stack_fffffffffffffec8;
  newval[1]._2_2_ = in_stack_fffffffffffffeca;
  newval[1]._4_4_ = in_stack_fffffffffffffecc;
  iVar7 = store_unique_xor(old,newval,in_stack_fffffffffffffeb8);
  local_80 = (void *)((long)local_80 + (long)iVar7 * 2);
  if ((uVar5 < uVar3) && (uVar6 < uVar4)) {
    in_stack_fffffffffffffed6 = *(ushort *)(*local_60 + (ulong)(uVar5 << 3) * 2);
    in_stack_fffffffffffffed4 = *(ushort *)(*local_70 + (ulong)(uVar6 << 3) * 2);
    do {
      if (in_stack_fffffffffffffed4 < in_stack_fffffffffffffed6) {
        local_50 = local_70 + uVar6;
        local_b8 = (__m128i)vlddqu_avx(*local_50);
        uVar6 = uVar6 + 1;
        if (uVar4 <= uVar6) goto LAB_00128a96;
        in_stack_fffffffffffffed4 = *(ushort *)(*local_70 + (ulong)(uVar6 * 8) * 2);
      }
      else {
        local_48 = local_60 + uVar5;
        local_b8 = (__m128i)vlddqu_avx(*local_48);
        uVar5 = uVar5 + 1;
        if (uVar3 <= uVar5) goto LAB_00128a96;
        in_stack_fffffffffffffed6 = *(ushort *)(*local_60 + (ulong)(uVar5 * 8) * 2);
      }
      sse_merge(&local_b8,&local_d8,&local_c8,&local_d8);
      old_00[0]._4_2_ = in_stack_fffffffffffffed4;
      old_00[0]._0_4_ = in_stack_fffffffffffffed0;
      old_00[0]._6_2_ = in_stack_fffffffffffffed6;
      old_00[1] = in_stack_fffffffffffffed8;
      newval_00[0]._6_2_ = uVar12;
      newval_00[0]._0_6_ = in_stack_fffffffffffffec0;
      newval_00[1]._0_2_ = in_stack_fffffffffffffec8;
      newval_00[1]._2_2_ = in_stack_fffffffffffffeca;
      newval_00[1]._4_4_ = in_stack_fffffffffffffecc;
      iVar7 = store_unique_xor(old_00,newval_00,in_stack_fffffffffffffeb8);
      local_80 = (void *)((long)local_80 + (long)iVar7 * 2);
    } while( true );
  }
LAB_00128af9:
  iVar8 = (int)((ulong)((long)local_80 - in_R8) >> 1);
  old_02[0]._4_2_ = in_stack_fffffffffffffed4;
  old_02[0]._0_4_ = iVar8;
  old_02[0]._6_2_ = in_stack_fffffffffffffed6;
  old_02[1] = in_stack_fffffffffffffed8;
  newval_02[0]._6_2_ = uVar12;
  newval_02[0]._0_6_ = in_stack_fffffffffffffec0;
  newval_02[1]._0_2_ = in_stack_fffffffffffffec8;
  newval_02[1]._2_2_ = in_stack_fffffffffffffeca;
  newval_02[1]._4_4_ = in_stack_fffffffffffffecc;
  iVar9 = store_unique_xor(old_02,newval_02,in_stack_fffffffffffffeb8);
  vpextrw_avx((undefined1  [16])local_d8,7);
  uVar10 = vpextrw_avx((undefined1  [16])local_d8,6);
  iVar7 = iVar9;
  if (in_stack_fffffffffffffeca != (short)uVar10) {
    iVar7 = iVar9 + 1;
    *(short *)(&stack0xfffffffffffffed8 + (long)iVar9 * 2) = in_stack_fffffffffffffeca;
  }
  if (uVar5 == uVar3) {
    memcpy(&stack0xfffffffffffffed8 + (long)iVar7 * 2,*local_60 + (ulong)(uVar5 << 3) * 2,
           (ulong)(local_64 + uVar3 * -8) << 1);
    uVar2 = local_64 + uVar3 * -8 + iVar7;
    if (uVar2 == 0) {
      memcpy(local_80,*local_70 + (ulong)(uVar6 << 3) * 2,(ulong)(local_74 + uVar6 * -8) << 1);
      local_54 = local_74 + uVar6 * -8 + iVar8;
    }
    else {
      qsort(&stack0xfffffffffffffed8,(long)(int)uVar2,2,uint16_compare);
      unique_xor((uint16_t *)&stack0xfffffffffffffed8,uVar2);
      iVar11 = xor_uint16((uint16_t *)CONCAT44(uVar5,uVar6),in_stack_fffffffffffffefc,
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                          in_stack_fffffffffffffee0);
      local_54 = iVar11 + iVar8;
    }
  }
  else {
    memcpy(&stack0xfffffffffffffed8 + (long)iVar7 * 2,*local_70 + (ulong)(uVar6 << 3) * 2,
           (ulong)(local_74 + uVar4 * -8) << 1);
    uVar2 = local_74 + uVar4 * -8 + iVar7;
    if (uVar2 == 0) {
      memcpy(local_80,*local_60 + (ulong)(uVar5 << 3) * 2,(ulong)(local_64 + uVar5 * -8) << 1);
      local_54 = local_64 + uVar5 * -8 + iVar8;
    }
    else {
      qsort(&stack0xfffffffffffffed8,(long)(int)uVar2,2,uint16_compare);
      unique_xor((uint16_t *)&stack0xfffffffffffffed8,uVar2);
      iVar11 = xor_uint16((uint16_t *)CONCAT44(uVar5,uVar6),in_stack_fffffffffffffefc,
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                          in_stack_fffffffffffffee0);
      local_54 = iVar11 + iVar8;
    }
  }
  return local_54;
LAB_00128a96:
  sse_merge(&local_b8,&local_d8,&local_c8,&local_d8);
  old_01[0]._4_2_ = in_stack_fffffffffffffed4;
  old_01[0]._0_4_ = in_stack_fffffffffffffed0;
  old_01[0]._6_2_ = in_stack_fffffffffffffed6;
  old_01[1] = in_stack_fffffffffffffed8;
  newval_01[0]._6_2_ = uVar12;
  newval_01[0]._0_6_ = in_stack_fffffffffffffec0;
  newval_01[1]._0_2_ = in_stack_fffffffffffffec8;
  newval_01[1]._2_2_ = in_stack_fffffffffffffeca;
  newval_01[1]._4_4_ = in_stack_fffffffffffffecc;
  iVar7 = store_unique_xor(old_01,newval_01,in_stack_fffffffffffffeb8);
  local_80 = (void *)((long)local_80 + (long)iVar7 * 2);
  goto LAB_00128af9;
}

Assistant:

CROARING_TARGET_AVX2
// a one-pass SSE xor algorithm
uint32_t xor_vector16(const uint16_t *__restrict__ array1, uint32_t length1,
                      const uint16_t *__restrict__ array2, uint32_t length2,
                      uint16_t *__restrict__ output) {
    if ((length1 < 8) || (length2 < 8)) {
        return xor_uint16(array1, length1, array2, length2, output);
    }
    __m128i vA, vB, V, vecMin, vecMax;
    __m128i laststore;
    uint16_t *initoutput = output;
    uint32_t len1 = length1 / 8;
    uint32_t len2 = length2 / 8;
    uint32_t pos1 = 0;
    uint32_t pos2 = 0;
    // we start the machine
    vA = _mm_lddqu_si128((const __m128i *)array1 + pos1);
    pos1++;
    vB = _mm_lddqu_si128((const __m128i *)array2 + pos2);
    pos2++;
    sse_merge(&vA, &vB, &vecMin, &vecMax);
    laststore = _mm_set1_epi16(-1);
    uint16_t buffer[17];
    output += store_unique_xor(laststore, vecMin, output);

    laststore = vecMin;
    if ((pos1 < len1) && (pos2 < len2)) {
        uint16_t curA, curB;
        curA = array1[8 * pos1];
        curB = array2[8 * pos2];
        while (true) {
            if (curA <= curB) {
                V = _mm_lddqu_si128((const __m128i *)array1 + pos1);
                pos1++;
                if (pos1 < len1) {
                    curA = array1[8 * pos1];
                } else {
                    break;
                }
            } else {
                V = _mm_lddqu_si128((const __m128i *)array2 + pos2);
                pos2++;
                if (pos2 < len2) {
                    curB = array2[8 * pos2];
                } else {
                    break;
                }
            }
            sse_merge(&V, &vecMax, &vecMin, &vecMax);
            // conditionally stores the last value of laststore as well as all
            // but the
            // last value of vecMin
            output += store_unique_xor(laststore, vecMin, output);
            laststore = vecMin;
        }
        sse_merge(&V, &vecMax, &vecMin, &vecMax);
        // conditionally stores the last value of laststore as well as all but
        // the
        // last value of vecMin
        output += store_unique_xor(laststore, vecMin, output);
        laststore = vecMin;
    }
    uint32_t len = (uint32_t)(output - initoutput);

    // we finish the rest off using a scalar algorithm
    // could be improved?
    // conditionally stores the last value of laststore as well as all but the
    // last value of vecMax,
    // we store to "buffer"
    int leftoversize = store_unique_xor(laststore, vecMax, buffer);
    uint16_t vec7 = (uint16_t)_mm_extract_epi16(vecMax, 7);
    uint16_t vec6 = (uint16_t)_mm_extract_epi16(vecMax, 6);
    if (vec7 != vec6) buffer[leftoversize++] = vec7;
    if (pos1 == len1) {
        memcpy(buffer + leftoversize, array1 + 8 * pos1,
               (length1 - 8 * len1) * sizeof(uint16_t));
        leftoversize += length1 - 8 * len1;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array2 + 8 * pos2,
                   (length2 - 8 * pos2) * sizeof(uint16_t));
            len += (length2 - 8 * pos2);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array2 + 8 * pos2,
                              length2 - 8 * pos2, output);
        }
    } else {
        memcpy(buffer + leftoversize, array2 + 8 * pos2,
               (length2 - 8 * len2) * sizeof(uint16_t));
        leftoversize += length2 - 8 * len2;
        if (leftoversize == 0) {  // trivial case
            memcpy(output, array1 + 8 * pos1,
                   (length1 - 8 * pos1) * sizeof(uint16_t));
            len += (length1 - 8 * pos1);
        } else {
            qsort(buffer, leftoversize, sizeof(uint16_t), uint16_compare);
            leftoversize = unique_xor(buffer, leftoversize);
            len += xor_uint16(buffer, leftoversize, array1 + 8 * pos1,
                              length1 - 8 * pos1, output);
        }
    }
    return len;
}